

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O0

PDFFormXObject * __thiscall
TIFFImageHandler::CreateFormXObjectFromTIFFStream
          (TIFFImageHandler *this,IByteReaderWithPosition *inTIFFStream,ObjectIDType inFormXObjectID
          ,TIFFUsageParameters *inTIFFUsageParameters)

{
  bool bVar1;
  bool bVar2;
  uchar uVar3;
  uchar uVar4;
  int iVar5;
  Trace *pTVar6;
  undefined4 extraout_var;
  IByteReaderWithPosition *local_50;
  StreamWithPos streamInfo;
  TIFF *input;
  PDFFormXObject *imageFormXObject;
  TIFFUsageParameters *inTIFFUsageParameters_local;
  ObjectIDType inFormXObjectID_local;
  IByteReaderWithPosition *inTIFFStream_local;
  TIFFImageHandler *this_local;
  
  input = (TIFF *)0x0;
  streamInfo.mOriginalPosition = 0;
  TIFFSetErrorHandler(ReportError);
  TIFFSetWarningHandler(ReportWarning);
  if ((this->mObjectsContext == (ObjectsContext *)0x0) ||
     (this->mContainerDocumentContext == (DocumentContext *)0x0)) {
    pTVar6 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar6,
                      "TIFFImageHandler::CreateFormXObjectFromTIFFFile. Unexpected Error, mObjectsContext or mContainerDocumentContext not initialized"
                     );
  }
  else {
    local_50 = inTIFFStream;
    iVar5 = (*(inTIFFStream->super_IByteReader)._vptr_IByteReader[6])();
    streamInfo.mStream = (IByteReaderWithPosition *)CONCAT44(extraout_var,iVar5);
    streamInfo.mOriginalPosition =
         (LongFilePositionType)
         TIFFClientOpen("Stream","r",&local_50,STATIC_streamRead,STATIC_streamWrite,
                        STATIC_streamSeek,STATIC_streamClose,STATIC_tiffSize,STATIC_tiffMap,
                        STATIC_tiffUnmap);
    if ((TIFF *)streamInfo.mOriginalPosition == (TIFF *)0x0) {
      pTVar6 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar6,
                        "TIFFImageHandler::CreateFormXObjectFromTIFFFile. cannot open stream for reading"
                       );
    }
    else {
      InitializeConversionState(this);
      this->mT2p->input = (TIFF *)streamInfo.mOriginalPosition;
      std::__cxx11::string::operator=((string *)&this->mT2p->inputFilePath,"");
      this->mT2p->pdf_page = inTIFFUsageParameters->PageIndex;
      bVar1 = (inTIFFUsageParameters->BWTreatment).AsImageMask;
      bVar2 = (inTIFFUsageParameters->BWTreatment).OneColor.UseCMYK;
      uVar3 = (inTIFFUsageParameters->BWTreatment).OneColor.RGBComponents[0];
      uVar4 = (inTIFFUsageParameters->BWTreatment).OneColor.RGBComponents[1];
      (this->mUserParameters).PageIndex = inTIFFUsageParameters->PageIndex;
      (this->mUserParameters).BWTreatment.AsImageMask = bVar1;
      (this->mUserParameters).BWTreatment.OneColor.UseCMYK = bVar2;
      (this->mUserParameters).BWTreatment.OneColor.RGBComponents[0] = uVar3;
      (this->mUserParameters).BWTreatment.OneColor.RGBComponents[1] = uVar4;
      *(undefined8 *)((this->mUserParameters).BWTreatment.OneColor.RGBComponents + 2) =
           *(undefined8 *)((inTIFFUsageParameters->BWTreatment).OneColor.RGBComponents + 2);
      *(undefined8 *)((this->mUserParameters).GrayscaleTreatment.OneColor.RGBComponents + 1) =
           *(undefined8 *)((inTIFFUsageParameters->GrayscaleTreatment).OneColor.RGBComponents + 1);
      *(undefined4 *)((this->mUserParameters).GrayscaleTreatment.ZeroColor.RGBComponents + 1) =
           *(undefined4 *)((inTIFFUsageParameters->GrayscaleTreatment).ZeroColor.RGBComponents + 1);
      *(undefined2 *)((this->mUserParameters).GrayscaleTreatment.ZeroColor.CMYKComponents + 2) =
           *(undefined2 *)((inTIFFUsageParameters->GrayscaleTreatment).ZeroColor.CMYKComponents + 2)
      ;
      input = (TIFF *)ConvertTiff2PDF(this,inFormXObjectID);
    }
  }
  DestroyConversionState(this);
  if (streamInfo.mOriginalPosition != 0) {
    TIFFClose((TIFF *)streamInfo.mOriginalPosition);
  }
  return (PDFFormXObject *)input;
}

Assistant:

PDFFormXObject* TIFFImageHandler::CreateFormXObjectFromTIFFStream(	IByteReaderWithPosition* inTIFFStream,
																	ObjectIDType inFormXObjectID,
																	const TIFFUsageParameters& inTIFFUsageParameters)
{

	PDFFormXObject* imageFormXObject = NULL;
	TIFF* input = NULL;

	do
	{
		TIFFSetErrorHandler(ReportError);
		TIFFSetWarningHandler(ReportWarning);

		if(!mObjectsContext || !mContainerDocumentContext)
		{
			TRACE_LOG("TIFFImageHandler::CreateFormXObjectFromTIFFFile. Unexpected Error, mObjectsContext or mContainerDocumentContext not initialized");
			break;
		}

		StreamWithPos streamInfo;
		streamInfo.mStream = inTIFFStream;
		streamInfo.mOriginalPosition = inTIFFStream->GetCurrentPosition();
		
		input = TIFFClientOpen("Stream","r",(thandle_t)&streamInfo,STATIC_streamRead,
																	STATIC_streamWrite,
																	STATIC_streamSeek,
																	STATIC_streamClose,
																	STATIC_tiffSize,
																	STATIC_tiffMap,
																	STATIC_tiffUnmap);
		if(!input)
		{
			TRACE_LOG("TIFFImageHandler::CreateFormXObjectFromTIFFFile. cannot open stream for reading");
			break;
		}


		InitializeConversionState();
		mT2p->input = input;
		mT2p->inputFilePath = "";
		mT2p->pdf_page = inTIFFUsageParameters.PageIndex;
		mUserParameters = inTIFFUsageParameters;

		imageFormXObject = ConvertTiff2PDF(inFormXObjectID);

	}while(false);

	DestroyConversionState();
	if(input != NULL)
		TIFFClose(input);

	return imageFormXObject;
}